

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readIntegers.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
njoy::ENDFtk::record::IntegerBase<6u,8u>::
readIntegers<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,IntegerBase<6u,8u> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end)

{
  iterator __position;
  pointer piVar1;
  pointer piVar2;
  int iVar3;
  int iVar4;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = 8;
  do {
    iVar3 = tools::disco::Integer<7u>::
            read<int,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,it);
    local_40 = (pointer)CONCAT44(local_40._4_4_,iVar3);
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (__return_storage_ptr__,__position,(int *)&local_40);
    }
    else {
      *__position._M_current = iVar3;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  local_30 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,__gnu_cxx::__ops::_Iter_pred<njoy::ENDFtk::record::IntegerBase<6u,8u>::readIntegers<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>const&)::_lambda(auto:1)_1_>>
            (&local_38);
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((local_38 != piVar1) &&
     (piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish,
     local_38 = (pointer)((long)local_38 + ((long)piVar2 - (long)piVar1)), piVar2 != local_38)) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = local_38;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector< int > readIntegers( Iterator& it, const Iterator& end ) {

  std::vector< int > sequence;

  // NDIGIT != 6 : there's a space
  if ( NDIGIT != 6 ) { ++it; }

  // read N ints of length NDIGIT + 1
  for ( unsigned int i = 0; i < N; ++i ) {

    sequence.emplace_back( record::Integer< NDIGIT + 1 >::Parser::read( it, end ) );
  }

  // remove trailing zeros
  auto iter = std::find_if( sequence.rbegin(), sequence.rend(),
                            [] ( auto value ) { return value != 0; } ).base();
  sequence.erase( iter, sequence.end() );

  // NDIGIT == 2 and 5 : there's a space, NDIGIT == 3: there's three spaces
  switch ( NDIGIT ) {

    case 2 :
    case 5 : { it += 1; break; }
    case 3 : { it += 3; break; }
    default : { break; }
  }

  return sequence;
}